

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void groupConcatFinalize(sqlite3_context *context)

{
  StrAccum *p;
  char *z;
  StrAccum *pAccum;
  sqlite3_context *context_local;
  
  p = (StrAccum *)sqlite3_aggregate_context(context,0);
  if (p != (StrAccum *)0x0) {
    if (p->tooBig == '\0') {
      if (p->mallocFailed == '\0') {
        z = sqlite3StrAccumFinish(p);
        sqlite3_result_text(context,z,-1,sqlite3_free);
      }
      else {
        sqlite3_result_error_nomem(context);
      }
    }
    else {
      sqlite3_result_error_toobig(context);
    }
  }
  return;
}

Assistant:

static void groupConcatFinalize(sqlite3_context *context){
  StrAccum *pAccum;
  pAccum = sqlite3_aggregate_context(context, 0);
  if( pAccum ){
    if( pAccum->tooBig ){
      sqlite3_result_error_toobig(context);
    }else if( pAccum->mallocFailed ){
      sqlite3_result_error_nomem(context);
    }else{    
      sqlite3_result_text(context, sqlite3StrAccumFinish(pAccum), -1, 
                          sqlite3_free);
    }
  }
}